

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O3

SQOpcode __thiscall SQCompiler::ChooseArithOpByToken(SQCompiler *this,SQInteger tok)

{
  if (tok < 0x122) {
    if (tok < 0x2d) {
      if (tok == 0x25) {
        return _OP_MOD;
      }
      if (tok == 0x2a) {
        return _OP_MUL;
      }
    }
    else {
      if (tok == 0x2d) {
        return _OP_SUB;
      }
      if (tok == 0x2f) {
        return _OP_DIV;
      }
    }
  }
  else if (tok < 0x13e) {
    if (tok == 0x122) {
      return _OP_SUB;
    }
    if (tok == 0x13d) {
      return _OP_MUL;
    }
  }
  else {
    if (tok == 0x13e) {
      return _OP_DIV;
    }
    if (tok == 0x13f) {
      return _OP_MOD;
    }
  }
  return _OP_ADD;
}

Assistant:

SQOpcode ChooseArithOpByToken(SQInteger tok)
    {
        switch(tok) {
            case TK_PLUSEQ: case '+': return _OP_ADD;
            case TK_MINUSEQ: case '-': return _OP_SUB;
            case TK_MULEQ: case '*': return _OP_MUL;
            case TK_DIVEQ: case '/': return _OP_DIV;
            case TK_MODEQ: case '%': return _OP_MOD;
            default: assert(0);
        }
        return _OP_ADD;
    }